

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O0

string * __thiscall FastPForLib::Simple8b_RLE<true>::name_abi_cxx11_(Simple8b_RLE<true> *this)

{
  string *in_RDI;
  allocator local_11 [17];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"Simple8b_RLE",local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::string name() const { return "Simple8b_RLE"; }